

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_bsp.cpp
# Opt level: O0

bool __thiscall
swrenderer::FWallCoords::Init(FWallCoords *this,DVector2 *pt1,DVector2 *pt2,double too_close)

{
  float *pfVar1;
  int32_t iVar2;
  float fVar3;
  float den_1;
  float den;
  float t;
  double too_close_local;
  DVector2 *pt2_local;
  DVector2 *pt1_local;
  FWallCoords *this_local;
  
  (this->tleft).X = (float)(pt1->X * ViewSin - pt1->Y * ViewCos);
  (this->tright).X = (float)(pt2->X * ViewSin - pt2->Y * ViewCos);
  (this->tleft).Y = (float)(pt1->X * ViewTanCos + pt1->Y * ViewTanSin);
  (this->tright).Y = (float)(pt2->X * ViewTanCos + pt2->Y * ViewTanSin);
  if ((MirrorFlags & 1) != 0) {
    fVar3 = (this->tleft).X;
    (this->tleft).X = -(this->tright).X;
    (this->tright).X = -fVar3;
    swapvalues<float>(&(this->tleft).Y,&(this->tright).Y);
  }
  if ((this->tleft).X < -(this->tleft).Y) {
    if ((this->tright).X < -(this->tright).Y) {
      return true;
    }
    fVar3 = (((this->tleft).X - (this->tright).X) - (this->tright).Y) + (this->tleft).Y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      return true;
    }
    this->sx1 = 0;
    this->sz1 = (this->tleft).Y +
                (((this->tright).Y - (this->tleft).Y) * ((this->tleft).X + (this->tleft).Y)) / fVar3
    ;
  }
  else {
    fVar3 = (this->tleft).X;
    pfVar1 = &(this->tleft).Y;
    if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
      return true;
    }
    fVar3 = (this->tleft).Y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      return true;
    }
    iVar2 = xs_RoundToInt((real64)(CenterX +
                                  ((double)(this->tleft).X * CenterX) / (double)(this->tleft).Y));
    this->sx1 = (short)iVar2;
    this->sz1 = (this->tleft).Y;
  }
  if ((double)this->sz1 < too_close) {
    return true;
  }
  if ((this->tright).Y < (this->tright).X) {
    fVar3 = (this->tleft).X;
    pfVar1 = &(this->tleft).Y;
    if (*pfVar1 <= fVar3 && fVar3 != *pfVar1) {
      return true;
    }
    fVar3 = (((this->tright).Y - (this->tleft).Y) - (this->tright).X) + (this->tleft).X;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      return true;
    }
    this->sx2 = (short)viewwidth;
    this->sz2 = (this->tleft).Y +
                (((this->tright).Y - (this->tleft).Y) * ((this->tleft).X - (this->tleft).Y)) / fVar3
    ;
  }
  else {
    if ((this->tright).X < -(this->tright).Y) {
      return true;
    }
    fVar3 = (this->tright).Y;
    if ((fVar3 == 0.0) && (!NAN(fVar3))) {
      return true;
    }
    iVar2 = xs_RoundToInt((real64)(CenterX +
                                  ((double)(this->tright).X * CenterX) / (double)(this->tright).Y));
    this->sx2 = (short)iVar2;
    this->sz2 = (this->tright).Y;
  }
  if (((double)this->sz2 < too_close) || (this->sx2 <= this->sx1)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FWallCoords::Init(const DVector2 &pt1, const DVector2 &pt2, double too_close)
{
	tleft.X =  float(pt1.X * ViewSin - pt1.Y * ViewCos);
	tright.X = float(pt2.X * ViewSin - pt2.Y * ViewCos);

	tleft.Y =  float(pt1.X * ViewTanCos + pt1.Y * ViewTanSin);
	tright.Y = float(pt2.X * ViewTanCos + pt2.Y * ViewTanSin);

	if (MirrorFlags & RF_XFLIP)
	{
		float t = -tleft.X;
		tleft.X = -tright.X;
		tright.X = t;
		swapvalues(tleft.Y, tright.Y);
	}

	if (tleft.X >= -tleft.Y)
	{
		if (tleft.X > tleft.Y) return true;	// left edge is off the right side
		if (tleft.Y == 0) return true;
		sx1 = xs_RoundToInt(CenterX + tleft.X * CenterX / tleft.Y);
		sz1 = tleft.Y;
	}
	else
	{
		if (tright.X < -tright.Y) return true;	// wall is off the left side
		float den = tleft.X - tright.X - tright.Y + tleft.Y;
		if (den == 0) return true;
		sx1 = 0;
		sz1 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X + tleft.Y) / den;
	}

	if (sz1 < too_close)
		return true;

	if (tright.X <= tright.Y)
	{
		if (tright.X < -tright.Y) return true;	// right edge is off the left side
		if (tright.Y == 0) return true;
		sx2 = xs_RoundToInt(CenterX + tright.X * CenterX / tright.Y);
		sz2 = tright.Y;
	}
	else
	{
		if (tleft.X > tleft.Y) return true;	// wall is off the right side
		float den = tright.Y - tleft.Y - tright.X + tleft.X;
		if (den == 0) return true;
		sx2 = viewwidth;
		sz2 = tleft.Y + (tright.Y - tleft.Y) * (tleft.X - tleft.Y) / den;
	}

	if (sz2 < too_close || sx2 <= sx1)
		return true;

	return false;
}